

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wav_file.cc
# Opt level: O0

void __thiscall webrtc::WavWriter::WriteSamples(WavWriter *this,int16_t *samples,size_t num_samples)

{
  ostream *poVar1;
  FatalMessage local_330;
  FatalMessageVoidify local_1b5 [13];
  FatalMessage local_1a8;
  string *local_30;
  string *_result;
  size_t written;
  size_t num_samples_local;
  int16_t *samples_local;
  WavWriter *this_local;
  
  written = num_samples;
  num_samples_local = (size_t)samples;
  samples_local = (int16_t *)this;
  _result = (string *)fwrite(samples,2,num_samples,(FILE *)this->file_handle_);
  local_30 = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                       (&written,(unsigned_long *)&_result,"num_samples == written");
  if (local_30 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/wav_file.cc"
               ,0x97,local_30);
    rtc::FatalMessage::stream(&local_1a8);
    rtc::FatalMessage::~FatalMessage(&local_1a8);
  }
  this->num_samples_ = (size_t)(_result + this->num_samples_);
  if (_result <= (string *)this->num_samples_) {
    return;
  }
  rtc::FatalMessageVoidify::FatalMessageVoidify(local_1b5);
  rtc::FatalMessage::FatalMessage
            (&local_330,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/wav_file.cc"
             ,0x99);
  poVar1 = rtc::FatalMessage::stream(&local_330);
  poVar1 = std::operator<<(poVar1,"Check failed: num_samples_ >= written");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"# ");
  rtc::FatalMessageVoidify::operator&(local_1b5,poVar1);
  rtc::FatalMessage::~FatalMessage(&local_330);
}

Assistant:

void WavWriter::WriteSamples(const int16_t* samples, size_t num_samples) {
#ifndef WEBRTC_ARCH_LITTLE_ENDIAN
#error "Need to convert samples to little-endian when writing to WAV file"
#endif
  const size_t written =
      fwrite(samples, sizeof(*samples), num_samples, file_handle_);
  RTC_CHECK_EQ(num_samples, written);
  num_samples_ += written;
  RTC_CHECK(num_samples_ >= written);  // detect size_t overflow
}